

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O1

void __thiscall
crnlib::
hash_map<crnlib::block,_crnlib::empty_type,_crnlib::hasher<crnlib::block>,_crnlib::equal_to<crnlib::block>_>
::rehash(hash_map<crnlib::block,_crnlib::empty_type,_crnlib::hasher<crnlib::block>,_crnlib::equal_to<crnlib::block>_>
         *this,uint new_hash_size)

{
  undefined4 uVar1;
  undefined4 uVar3;
  undefined8 uVar2;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  uint32 uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  void *pvVar38;
  undefined1 *puVar39;
  long lVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  raw_node *prVar44;
  raw_node *prVar45;
  undefined4 uVar46;
  undefined4 uVar48;
  undefined1 auVar47 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  int iVar68;
  int iVar71;
  int iVar72;
  undefined1 auVar69 [16];
  int iVar73;
  undefined1 auVar70 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  int iVar87;
  int iVar91;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  elemental_vector local_48;
  uint local_38;
  undefined8 local_30;
  
  if ((this->m_num_valid <= new_hash_size) &&
     (uVar37 = (ulong)new_hash_size, (this->m_values).m_size != new_hash_size)) {
    local_48.m_p = (void *)0x0;
    local_48.m_size = 0;
    local_48.m_capacity = 0;
    local_38 = 0x20;
    local_30 = 0;
    if (new_hash_size != 0) {
      if (new_hash_size != 0) {
        elemental_vector::increase_capacity
                  (&local_48,new_hash_size,new_hash_size == 1,0x44,
                   vector<crnlib::hash_map<crnlib::block,_crnlib::empty_type,_crnlib::hasher<crnlib::block>,_crnlib::equal_to<crnlib::block>_>::raw_node>
                   ::object_mover,false);
      }
      auVar33 = _DAT_001b10b0;
      auVar32 = _DAT_001b10a0;
      auVar31 = _DAT_001b1090;
      auVar30 = _DAT_001b1080;
      auVar29 = _DAT_001b1070;
      auVar28 = _DAT_001b1060;
      auVar27 = _DAT_001b1050;
      if (new_hash_size - local_48.m_size != 0) {
        uVar35 = (ulong)(new_hash_size - local_48.m_size) * 0x44 - 0x44;
        auVar69._8_8_ = 0;
        auVar69._0_8_ = uVar35;
        uVar46 = SUB164(auVar69 * ZEXT816(0xf0f0f0f0f0f0f0f1),8);
        uVar48 = (undefined4)(uVar35 / 0x110000000);
        auVar74._0_8_ = CONCAT44(uVar48,uVar46);
        auVar74._8_4_ = uVar46;
        auVar74._12_4_ = uVar48;
        auVar47._0_8_ = auVar74._0_8_ >> 6;
        auVar47._8_8_ = auVar74._8_8_ >> 6;
        puVar39 = (undefined1 *)((long)local_48.m_p + (ulong)local_48.m_size * 0x44 + 0x43d);
        uVar36 = 0;
        do {
          auVar66._8_4_ = (int)uVar36;
          auVar66._0_8_ = uVar36;
          auVar66._12_4_ = (int)(uVar36 >> 0x20);
          auVar69 = auVar47 ^ auVar33;
          auVar74 = (auVar66 | auVar32) ^ auVar33;
          iVar68 = auVar69._0_4_;
          iVar87 = -(uint)(iVar68 < auVar74._0_4_);
          iVar71 = auVar69._4_4_;
          auVar76._4_4_ = -(uint)(iVar71 < auVar74._4_4_);
          iVar72 = auVar69._8_4_;
          iVar91 = -(uint)(iVar72 < auVar74._8_4_);
          iVar73 = auVar69._12_4_;
          auVar76._12_4_ = -(uint)(iVar73 < auVar74._12_4_);
          auVar58._4_4_ = iVar87;
          auVar58._0_4_ = iVar87;
          auVar58._8_4_ = iVar91;
          auVar58._12_4_ = iVar91;
          auVar69 = pshuflw(in_XMM1,auVar58,0xe8);
          auVar75._4_4_ = -(uint)(auVar74._4_4_ == iVar71);
          auVar75._12_4_ = -(uint)(auVar74._12_4_ == iVar73);
          auVar75._0_4_ = auVar75._4_4_;
          auVar75._8_4_ = auVar75._12_4_;
          auVar58 = pshuflw(in_XMM2,auVar75,0xe8);
          auVar76._0_4_ = auVar76._4_4_;
          auVar76._8_4_ = auVar76._12_4_;
          auVar74 = pshuflw(auVar69,auVar76,0xe8);
          auVar49._8_4_ = 0xffffffff;
          auVar49._0_8_ = 0xffffffffffffffff;
          auVar49._12_4_ = 0xffffffff;
          auVar49 = (auVar74 | auVar58 & auVar69) ^ auVar49;
          auVar69 = packssdw(auVar49,auVar49);
          if ((auVar69 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar39[-0x3fc] = 0;
          }
          auVar14._4_4_ = iVar87;
          auVar14._0_4_ = iVar87;
          auVar14._8_4_ = iVar91;
          auVar14._12_4_ = iVar91;
          auVar76 = auVar75 & auVar14 | auVar76;
          auVar69 = packssdw(auVar76,auVar76);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar69 = packssdw(auVar69 ^ auVar4,auVar69 ^ auVar4);
          auVar69 = packsswb(auVar69,auVar69);
          if ((auVar69._0_4_ >> 8 & 1) != 0) {
            puVar39[-0x3b8] = 0;
          }
          auVar69 = (auVar66 | auVar31) ^ auVar33;
          auVar59._0_4_ = -(uint)(iVar68 < auVar69._0_4_);
          auVar59._4_4_ = -(uint)(iVar71 < auVar69._4_4_);
          auVar59._8_4_ = -(uint)(iVar72 < auVar69._8_4_);
          auVar59._12_4_ = -(uint)(iVar73 < auVar69._12_4_);
          auVar77._4_4_ = auVar59._0_4_;
          auVar77._0_4_ = auVar59._0_4_;
          auVar77._8_4_ = auVar59._8_4_;
          auVar77._12_4_ = auVar59._8_4_;
          iVar87 = -(uint)(auVar69._4_4_ == iVar71);
          iVar91 = -(uint)(auVar69._12_4_ == iVar73);
          auVar15._4_4_ = iVar87;
          auVar15._0_4_ = iVar87;
          auVar15._8_4_ = iVar91;
          auVar15._12_4_ = iVar91;
          auVar88._4_4_ = auVar59._4_4_;
          auVar88._0_4_ = auVar59._4_4_;
          auVar88._8_4_ = auVar59._12_4_;
          auVar88._12_4_ = auVar59._12_4_;
          auVar69 = auVar15 & auVar77 | auVar88;
          auVar69 = packssdw(auVar69,auVar69);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar69 = packssdw(auVar69 ^ auVar5,auVar69 ^ auVar5);
          auVar69 = packsswb(auVar69,auVar69);
          if ((auVar69._0_4_ >> 0x10 & 1) != 0) {
            puVar39[-0x374] = 0;
          }
          auVar69 = pshufhw(auVar69,auVar77,0x84);
          auVar16._4_4_ = iVar87;
          auVar16._0_4_ = iVar87;
          auVar16._8_4_ = iVar91;
          auVar16._12_4_ = iVar91;
          auVar49 = pshufhw(auVar59,auVar16,0x84);
          auVar74 = pshufhw(auVar69,auVar88,0x84);
          auVar50._8_4_ = 0xffffffff;
          auVar50._0_8_ = 0xffffffffffffffff;
          auVar50._12_4_ = 0xffffffff;
          auVar50 = (auVar74 | auVar49 & auVar69) ^ auVar50;
          auVar69 = packssdw(auVar50,auVar50);
          auVar69 = packsswb(auVar69,auVar69);
          if ((auVar69._0_4_ >> 0x18 & 1) != 0) {
            puVar39[-0x330] = 0;
          }
          auVar69 = (auVar66 | auVar30) ^ auVar33;
          auVar60._0_4_ = -(uint)(iVar68 < auVar69._0_4_);
          auVar60._4_4_ = -(uint)(iVar71 < auVar69._4_4_);
          auVar60._8_4_ = -(uint)(iVar72 < auVar69._8_4_);
          auVar60._12_4_ = -(uint)(iVar73 < auVar69._12_4_);
          auVar17._4_4_ = auVar60._0_4_;
          auVar17._0_4_ = auVar60._0_4_;
          auVar17._8_4_ = auVar60._8_4_;
          auVar17._12_4_ = auVar60._8_4_;
          auVar49 = pshuflw(auVar88,auVar17,0xe8);
          auVar51._0_4_ = -(uint)(auVar69._0_4_ == iVar68);
          auVar51._4_4_ = -(uint)(auVar69._4_4_ == iVar71);
          auVar51._8_4_ = -(uint)(auVar69._8_4_ == iVar72);
          auVar51._12_4_ = -(uint)(auVar69._12_4_ == iVar73);
          auVar78._4_4_ = auVar51._4_4_;
          auVar78._0_4_ = auVar51._4_4_;
          auVar78._8_4_ = auVar51._12_4_;
          auVar78._12_4_ = auVar51._12_4_;
          auVar69 = pshuflw(auVar51,auVar78,0xe8);
          auVar79._4_4_ = auVar60._4_4_;
          auVar79._0_4_ = auVar60._4_4_;
          auVar79._8_4_ = auVar60._12_4_;
          auVar79._12_4_ = auVar60._12_4_;
          auVar74 = pshuflw(auVar60,auVar79,0xe8);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar69 = packssdw(auVar69 & auVar49,(auVar74 | auVar69 & auVar49) ^ auVar6);
          auVar69 = packsswb(auVar69,auVar69);
          if ((auVar69 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar39[-0x2ec] = 0;
          }
          auVar18._4_4_ = auVar60._0_4_;
          auVar18._0_4_ = auVar60._0_4_;
          auVar18._8_4_ = auVar60._8_4_;
          auVar18._12_4_ = auVar60._8_4_;
          auVar79 = auVar78 & auVar18 | auVar79;
          auVar74 = packssdw(auVar79,auVar79);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar69 = packssdw(auVar69,auVar74 ^ auVar7);
          auVar69 = packsswb(auVar69,auVar69);
          if ((auVar69._4_2_ >> 8 & 1) != 0) {
            puVar39[-0x2a8] = 0;
          }
          auVar69 = (auVar66 | auVar29) ^ auVar33;
          auVar61._0_4_ = -(uint)(iVar68 < auVar69._0_4_);
          auVar61._4_4_ = -(uint)(iVar71 < auVar69._4_4_);
          auVar61._8_4_ = -(uint)(iVar72 < auVar69._8_4_);
          auVar61._12_4_ = -(uint)(iVar73 < auVar69._12_4_);
          auVar80._4_4_ = auVar61._0_4_;
          auVar80._0_4_ = auVar61._0_4_;
          auVar80._8_4_ = auVar61._8_4_;
          auVar80._12_4_ = auVar61._8_4_;
          iVar87 = -(uint)(auVar69._4_4_ == iVar71);
          iVar91 = -(uint)(auVar69._12_4_ == iVar73);
          auVar19._4_4_ = iVar87;
          auVar19._0_4_ = iVar87;
          auVar19._8_4_ = iVar91;
          auVar19._12_4_ = iVar91;
          auVar89._4_4_ = auVar61._4_4_;
          auVar89._0_4_ = auVar61._4_4_;
          auVar89._8_4_ = auVar61._12_4_;
          auVar89._12_4_ = auVar61._12_4_;
          auVar69 = auVar19 & auVar80 | auVar89;
          auVar69 = packssdw(auVar69,auVar69);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar69 = packssdw(auVar69 ^ auVar8,auVar69 ^ auVar8);
          auVar69 = packsswb(auVar69,auVar69);
          if ((auVar69 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar39[-0x264] = 0;
          }
          auVar69 = pshufhw(auVar69,auVar80,0x84);
          auVar20._4_4_ = iVar87;
          auVar20._0_4_ = iVar87;
          auVar20._8_4_ = iVar91;
          auVar20._12_4_ = iVar91;
          auVar49 = pshufhw(auVar61,auVar20,0x84);
          auVar74 = pshufhw(auVar69,auVar89,0x84);
          auVar52._8_4_ = 0xffffffff;
          auVar52._0_8_ = 0xffffffffffffffff;
          auVar52._12_4_ = 0xffffffff;
          auVar52 = (auVar74 | auVar49 & auVar69) ^ auVar52;
          auVar69 = packssdw(auVar52,auVar52);
          auVar69 = packsswb(auVar69,auVar69);
          if ((auVar69._6_2_ >> 8 & 1) != 0) {
            puVar39[-0x220] = 0;
          }
          auVar69 = (auVar66 | auVar28) ^ auVar33;
          auVar62._0_4_ = -(uint)(iVar68 < auVar69._0_4_);
          auVar62._4_4_ = -(uint)(iVar71 < auVar69._4_4_);
          auVar62._8_4_ = -(uint)(iVar72 < auVar69._8_4_);
          auVar62._12_4_ = -(uint)(iVar73 < auVar69._12_4_);
          auVar21._4_4_ = auVar62._0_4_;
          auVar21._0_4_ = auVar62._0_4_;
          auVar21._8_4_ = auVar62._8_4_;
          auVar21._12_4_ = auVar62._8_4_;
          auVar49 = pshuflw(auVar89,auVar21,0xe8);
          auVar53._0_4_ = -(uint)(auVar69._0_4_ == iVar68);
          auVar53._4_4_ = -(uint)(auVar69._4_4_ == iVar71);
          auVar53._8_4_ = -(uint)(auVar69._8_4_ == iVar72);
          auVar53._12_4_ = -(uint)(auVar69._12_4_ == iVar73);
          auVar81._4_4_ = auVar53._4_4_;
          auVar81._0_4_ = auVar53._4_4_;
          auVar81._8_4_ = auVar53._12_4_;
          auVar81._12_4_ = auVar53._12_4_;
          auVar69 = pshuflw(auVar53,auVar81,0xe8);
          auVar82._4_4_ = auVar62._4_4_;
          auVar82._0_4_ = auVar62._4_4_;
          auVar82._8_4_ = auVar62._12_4_;
          auVar82._12_4_ = auVar62._12_4_;
          auVar74 = pshuflw(auVar62,auVar82,0xe8);
          auVar63._8_4_ = 0xffffffff;
          auVar63._0_8_ = 0xffffffffffffffff;
          auVar63._12_4_ = 0xffffffff;
          auVar63 = (auVar74 | auVar69 & auVar49) ^ auVar63;
          auVar74 = packssdw(auVar63,auVar63);
          auVar69 = packsswb(auVar69 & auVar49,auVar74);
          if ((auVar69 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar39[-0x1dc] = 0;
          }
          auVar22._4_4_ = auVar62._0_4_;
          auVar22._0_4_ = auVar62._0_4_;
          auVar22._8_4_ = auVar62._8_4_;
          auVar22._12_4_ = auVar62._8_4_;
          auVar82 = auVar81 & auVar22 | auVar82;
          auVar74 = packssdw(auVar82,auVar82);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar74 = packssdw(auVar74 ^ auVar9,auVar74 ^ auVar9);
          auVar69 = packsswb(auVar69,auVar74);
          if ((auVar69._8_2_ >> 8 & 1) != 0) {
            puVar39[-0x198] = 0;
          }
          auVar69 = (auVar66 | auVar27) ^ auVar33;
          auVar64._0_4_ = -(uint)(iVar68 < auVar69._0_4_);
          auVar64._4_4_ = -(uint)(iVar71 < auVar69._4_4_);
          auVar64._8_4_ = -(uint)(iVar72 < auVar69._8_4_);
          auVar64._12_4_ = -(uint)(iVar73 < auVar69._12_4_);
          auVar83._4_4_ = auVar64._0_4_;
          auVar83._0_4_ = auVar64._0_4_;
          auVar83._8_4_ = auVar64._8_4_;
          auVar83._12_4_ = auVar64._8_4_;
          iVar87 = -(uint)(auVar69._4_4_ == iVar71);
          iVar91 = -(uint)(auVar69._12_4_ == iVar73);
          auVar23._4_4_ = iVar87;
          auVar23._0_4_ = iVar87;
          auVar23._8_4_ = iVar91;
          auVar23._12_4_ = iVar91;
          auVar90._4_4_ = auVar64._4_4_;
          auVar90._0_4_ = auVar64._4_4_;
          auVar90._8_4_ = auVar64._12_4_;
          auVar90._12_4_ = auVar64._12_4_;
          auVar69 = auVar23 & auVar83 | auVar90;
          auVar69 = packssdw(auVar69,auVar69);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar69 = packssdw(auVar69 ^ auVar10,auVar69 ^ auVar10);
          auVar69 = packsswb(auVar69,auVar69);
          if ((auVar69 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            puVar39[-0x154] = 0;
          }
          auVar69 = pshufhw(auVar69,auVar83,0x84);
          auVar24._4_4_ = iVar87;
          auVar24._0_4_ = iVar87;
          auVar24._8_4_ = iVar91;
          auVar24._12_4_ = iVar91;
          auVar49 = pshufhw(auVar64,auVar24,0x84);
          auVar74 = pshufhw(auVar69,auVar90,0x84);
          auVar54._8_4_ = 0xffffffff;
          auVar54._0_8_ = 0xffffffffffffffff;
          auVar54._12_4_ = 0xffffffff;
          auVar54 = (auVar74 | auVar49 & auVar69) ^ auVar54;
          auVar69 = packssdw(auVar54,auVar54);
          auVar69 = packsswb(auVar69,auVar69);
          if ((auVar69._10_2_ >> 8 & 1) != 0) {
            puVar39[-0x110] = 0;
          }
          auVar69 = (auVar66 | _DAT_001b1040) ^ auVar33;
          auVar65._0_4_ = -(uint)(iVar68 < auVar69._0_4_);
          auVar65._4_4_ = -(uint)(iVar71 < auVar69._4_4_);
          auVar65._8_4_ = -(uint)(iVar72 < auVar69._8_4_);
          auVar65._12_4_ = -(uint)(iVar73 < auVar69._12_4_);
          auVar25._4_4_ = auVar65._0_4_;
          auVar25._0_4_ = auVar65._0_4_;
          auVar25._8_4_ = auVar65._8_4_;
          auVar25._12_4_ = auVar65._8_4_;
          auVar49 = pshuflw(auVar90,auVar25,0xe8);
          auVar55._0_4_ = -(uint)(auVar69._0_4_ == iVar68);
          auVar55._4_4_ = -(uint)(auVar69._4_4_ == iVar71);
          auVar55._8_4_ = -(uint)(auVar69._8_4_ == iVar72);
          auVar55._12_4_ = -(uint)(auVar69._12_4_ == iVar73);
          auVar84._4_4_ = auVar55._4_4_;
          auVar84._0_4_ = auVar55._4_4_;
          auVar84._8_4_ = auVar55._12_4_;
          auVar84._12_4_ = auVar55._12_4_;
          auVar69 = pshuflw(auVar55,auVar84,0xe8);
          auVar85._4_4_ = auVar65._4_4_;
          auVar85._0_4_ = auVar65._4_4_;
          auVar85._8_4_ = auVar65._12_4_;
          auVar85._12_4_ = auVar65._12_4_;
          auVar74 = pshuflw(auVar65,auVar85,0xe8);
          auVar11._8_4_ = 0xffffffff;
          auVar11._0_8_ = 0xffffffffffffffff;
          auVar11._12_4_ = 0xffffffff;
          auVar69 = packssdw(auVar69 & auVar49,(auVar74 | auVar69 & auVar49) ^ auVar11);
          auVar69 = packsswb(auVar69,auVar69);
          if ((auVar69 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar39[-0xcc] = 0;
          }
          auVar26._4_4_ = auVar65._0_4_;
          auVar26._0_4_ = auVar65._0_4_;
          auVar26._8_4_ = auVar65._8_4_;
          auVar26._12_4_ = auVar65._8_4_;
          auVar85 = auVar84 & auVar26 | auVar85;
          auVar74 = packssdw(auVar85,auVar85);
          auVar12._8_4_ = 0xffffffff;
          auVar12._0_8_ = 0xffffffffffffffff;
          auVar12._12_4_ = 0xffffffff;
          auVar69 = packssdw(auVar69,auVar74 ^ auVar12);
          auVar69 = packsswb(auVar69,auVar69);
          if ((auVar69._12_2_ >> 8 & 1) != 0) {
            puVar39[-0x88] = 0;
          }
          auVar69 = (auVar66 | _DAT_001b1030) ^ auVar33;
          auVar56._0_4_ = -(uint)(iVar68 < auVar69._0_4_);
          auVar56._4_4_ = -(uint)(iVar71 < auVar69._4_4_);
          auVar56._8_4_ = -(uint)(iVar72 < auVar69._8_4_);
          auVar56._12_4_ = -(uint)(iVar73 < auVar69._12_4_);
          auVar86._4_4_ = auVar56._0_4_;
          auVar86._0_4_ = auVar56._0_4_;
          auVar86._8_4_ = auVar56._8_4_;
          auVar86._12_4_ = auVar56._8_4_;
          auVar67._4_4_ = -(uint)(auVar69._4_4_ == iVar71);
          auVar67._12_4_ = -(uint)(auVar69._12_4_ == iVar73);
          auVar67._0_4_ = auVar67._4_4_;
          auVar67._8_4_ = auVar67._12_4_;
          auVar70._4_4_ = auVar56._4_4_;
          auVar70._0_4_ = auVar56._4_4_;
          auVar70._8_4_ = auVar56._12_4_;
          auVar70._12_4_ = auVar56._12_4_;
          auVar74 = auVar67 & auVar86 | auVar70;
          auVar69 = packssdw(auVar56,auVar74);
          auVar13._8_4_ = 0xffffffff;
          auVar13._0_8_ = 0xffffffffffffffff;
          auVar13._12_4_ = 0xffffffff;
          auVar69 = packssdw(auVar69 ^ auVar13,auVar69 ^ auVar13);
          auVar69 = packsswb(auVar69,auVar69);
          if ((auVar69 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar39[-0x44] = 0;
          }
          auVar69 = pshufhw(auVar69,auVar86,0x84);
          auVar74 = pshufhw(auVar74,auVar67,0x84);
          in_XMM2 = auVar74 & auVar69;
          auVar69 = pshufhw(auVar69,auVar70,0x84);
          auVar57._8_4_ = 0xffffffff;
          auVar57._0_8_ = 0xffffffffffffffff;
          auVar57._12_4_ = 0xffffffff;
          auVar57 = (auVar69 | in_XMM2) ^ auVar57;
          auVar69 = packssdw(auVar57,auVar57);
          in_XMM1 = packsswb(auVar69,auVar69);
          if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
            *puVar39 = 0;
          }
          uVar36 = uVar36 + 0x10;
          puVar39 = puVar39 + 0x440;
        } while ((uVar35 / 0x44 + 0x10 & 0xfffffffffffffff0) != uVar36);
      }
      local_48.m_size = new_hash_size;
    }
    local_38 = 0x20;
    if (1 < new_hash_size) {
      do {
        local_38 = local_38 - 1;
        uVar41 = (uint)uVar37;
        uVar37 = uVar37 >> 1;
      } while (3 < uVar41);
    }
    local_30._4_4_ = 0xffffffff;
    uVar37 = (ulong)(this->m_values).m_size;
    if (uVar37 != 0) {
      prVar44 = (this->m_values).m_p;
      prVar45 = prVar44 + uVar37;
      do {
        if (prVar44->m_bits[0x41] != '\0') {
          uVar34 = fast_hash(prVar44,0x40);
          uVar41 = uVar34 * -0x61c88647 >> ((byte)local_38 & 0x1f);
          pvVar38 = (void *)((long)local_48.m_p + (ulong)uVar41 * 0x44);
          if (*(char *)((long)local_48.m_p + (ulong)uVar41 * 0x44 + 0x41) != '\0') {
            uVar43 = uVar41;
            do {
              uVar42 = uVar43 - 1;
              if (uVar43 == 0) {
                uVar42 = local_48.m_size - 1;
              }
              if (uVar42 == uVar41) goto LAB_00107de7;
              pvVar38 = (void *)((long)pvVar38 + -0x44);
              if (uVar43 == 0) {
                pvVar38 = (void *)((long)local_48.m_p + (ulong)(local_48.m_size - 1) * 0x44);
              }
              uVar43 = uVar42;
            } while (*(char *)((long)pvVar38 + 0x41) != '\0');
          }
          lVar40 = 0;
          do {
            *(uint8 *)((long)pvVar38 + lVar40 * 4) = prVar44->m_bits[lVar40 * 4];
            *(uint8 *)((long)pvVar38 + lVar40 * 4 + 1) = prVar44->m_bits[lVar40 * 4 + 1];
            *(uint8 *)((long)pvVar38 + lVar40 * 4 + 2) = prVar44->m_bits[lVar40 * 4 + 2];
            *(uint8 *)((long)pvVar38 + lVar40 * 4 + 3) = prVar44->m_bits[lVar40 * 4 + 3];
            lVar40 = lVar40 + 1;
          } while (lVar40 != 0x10);
          *(uint8 *)((long)pvVar38 + 0x40) = prVar44->m_bits[0x40];
          *(undefined1 *)((long)pvVar38 + 0x41) = 1;
          prVar44->m_bits[0x41] = '\0';
          local_30._0_4_ = (uint)local_30 + 1;
LAB_00107de7:
          if ((uint)local_30 == this->m_num_valid) break;
        }
        prVar44 = prVar44 + 1;
      } while (prVar44 != prVar45);
    }
    local_30 = CONCAT44(new_hash_size + 1 >> 1,(uint)local_30);
    prVar44 = (this->m_values).m_p;
    if (prVar44 != (raw_node *)0x0) {
      crnlib_free(prVar44);
      (this->m_values).m_p = (raw_node *)0x0;
      (this->m_values).m_size = 0;
      (this->m_values).m_capacity = 0;
    }
    this->m_hash_shift = 0x20;
    prVar44 = (this->m_values).m_p;
    (this->m_values).m_p = (raw_node *)local_48.m_p;
    uVar1 = (this->m_values).m_size;
    uVar3 = (this->m_values).m_capacity;
    (this->m_values).m_size = local_48.m_size;
    (this->m_values).m_capacity = local_48.m_capacity;
    local_48.m_size = uVar1;
    local_48.m_capacity = uVar3;
    local_48.m_p = prVar44;
    this->m_hash_shift = local_38;
    local_38 = 0x20;
    uVar2._0_4_ = this->m_num_valid;
    uVar2._4_4_ = this->m_grow_threshold;
    this->m_num_valid = (uint)local_30;
    this->m_grow_threshold = local_30._4_4_;
    local_30 = uVar2;
    if (uVar1 != 0) {
      if (prVar44 != (raw_node *)0x0) {
        crnlib_free(prVar44);
        local_48.m_p = (void *)0x0;
        local_48.m_size = 0;
        local_48.m_capacity = 0;
      }
      local_30 = 0;
    }
    local_38 = 0x20;
    if (local_48.m_p != (void *)0x0) {
      crnlib_free(local_48.m_p);
    }
  }
  return;
}

Assistant:

inline void rehash(uint new_hash_size) {
    CRNLIB_ASSERT(new_hash_size >= m_num_valid);
    CRNLIB_ASSERT(math::is_power_of_2(new_hash_size));

    if ((new_hash_size < m_num_valid) || (new_hash_size == m_values.size()))
      return;

    hash_map new_map;
    new_map.m_values.resize(new_hash_size);
    new_map.m_hash_shift = 32U - math::floor_log2i(new_hash_size);
    CRNLIB_ASSERT(new_hash_size == (1U << (32U - new_map.m_hash_shift)));
    new_map.m_grow_threshold = UINT_MAX;

    node* pNode = reinterpret_cast<node*>(m_values.begin());
    node* pNode_end = pNode + m_values.size();

    while (pNode != pNode_end) {
      if (pNode->state) {
        new_map.move_into(pNode);

        if (new_map.m_num_valid == m_num_valid)
          break;
      }

      pNode++;
    }

    new_map.m_grow_threshold = (new_hash_size + 1U) >> 1U;

    m_values.clear_no_destruction();
    m_hash_shift = 32;

    swap(new_map);
  }